

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

bool __thiscall Client::DoSend(Client *this)

{
  size_t sVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  ssize_t sVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  char buf [8192];
  char local_2018 [8192];
  
  sVar1 = this->send_buffer_gpos;
  uVar7 = (this->send_buffer)._M_string_length - 1;
  uVar6 = this->send_buffer_used;
  uVar4 = 0x2000;
  if (uVar6 < 0x2000) {
    uVar4 = uVar6;
  }
  if (uVar6 == 0) {
    __n = 0;
  }
  else {
    pcVar2 = (this->send_buffer)._M_dataplus._M_p;
    uVar6 = this->send_buffer_gpos;
    __n = 0;
    do {
      local_2018[__n] = pcVar2[uVar6];
      uVar6 = uVar6 + 1 & uVar7;
      this->send_buffer_gpos = uVar6;
      __n = __n + 1;
    } while (uVar4 != __n);
  }
  sVar5 = send(((this->impl)._M_t.
                super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
                super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
                super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock,local_2018,__n,0);
  uVar3 = (uint)sVar5;
  if (-1 < (int)uVar3) {
    this->send_buffer_gpos = sVar1 + (uVar3 & 0x7fffffff) & uVar7;
    this->send_buffer_used = this->send_buffer_used - (ulong)(uVar3 & 0x7fffffff);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool Client::DoSend()
{
	char buf[8192];

	const std::size_t mask = this->send_buffer.length() - 1;
	const std::size_t gpos = this->send_buffer_gpos;

	std::size_t to_send;
	for (to_send = 0; to_send < std::min(this->send_buffer_used, sizeof(buf)); ++to_send)
	{
		buf[to_send] = this->send_buffer[this->send_buffer_gpos];
		this->send_buffer_gpos = (this->send_buffer_gpos + 1) & mask;
	}

	const int written = send(this->impl->sock, buf, to_send, 0);

	if (written < 0 || written == SOCKET_ERROR)
		return false;

	this->send_buffer_gpos = (gpos + written) & mask;
	this->send_buffer_used -= written;

	return true;
}